

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O1

size_type __thiscall duckdb_re2::StringPiece::rfind(StringPiece *this,StringPiece *s,size_type pos)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  size_type sVar4;
  char *pcVar5;
  
  uVar1 = this->size_;
  uVar2 = s->size_;
  sVar4 = 0xffffffffffffffff;
  if (uVar2 <= uVar1) {
    if (uVar2 == 0) {
      sVar4 = pos;
      if (uVar1 < pos) {
        sVar4 = uVar1;
      }
    }
    else {
      if (uVar1 - uVar2 < pos) {
        pos = uVar1 - uVar2;
      }
      pcVar5 = this->data_ + uVar2 + pos;
      pcVar3 = std::__find_end<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         (this->data_,pcVar5,s->data_,s->data_ + uVar2);
      sVar4 = 0xffffffffffffffff;
      if (pcVar3 != pcVar5) {
        sVar4 = (long)pcVar3 - (long)this->data_;
      }
    }
  }
  return sVar4;
}

Assistant:

StringPiece::size_type StringPiece::rfind(const StringPiece& s,
                                          size_type pos) const {
  if (size_ < s.size_) return npos;
  if (s.size_ == 0) return std::min(size_, pos);
  const_pointer last = data_ + std::min(size_ - s.size_, pos) + s.size_;
  const_pointer result = std::find_end(data_, last, s.data_, s.data_ + s.size_);
  return result != last ? result - data_ : npos;
}